

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

optional<cmListFileContext> * __thiscall
cmListFileParser::CheckNesting
          (optional<cmListFileContext> *__return_storage_ptr__,cmListFileParser *this)

{
  cmListFile *this_00;
  char *pcVar1;
  string *psVar2;
  bool bVar3;
  reference pvVar4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_cb0;
  allocator<char> local_c81;
  string local_c80;
  cmListFileContext local_c60;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bf0;
  allocator<char> local_bc1;
  string local_bc0;
  value_type local_ba0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b28;
  allocator<char> local_af9;
  string local_af8;
  cmListFileContext local_ad8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a68;
  allocator<char> local_a39;
  string local_a38;
  value_type local_a18;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9a0;
  allocator<char> local_971;
  string local_970;
  cmListFileContext local_950;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8e0;
  allocator<char> local_8b1;
  string local_8b0;
  value_type local_890;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_818;
  allocator<char> local_7e9;
  string local_7e8;
  cmListFileContext local_7c8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_758;
  allocator<char> local_729;
  string local_728;
  value_type local_708;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_690;
  allocator<char> local_661;
  string local_660;
  cmListFileContext local_640;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d0;
  allocator<char> local_5a1;
  string local_5a0;
  value_type local_580;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_508;
  allocator<char> local_4d9;
  string local_4d8;
  cmListFileContext local_4b8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_448;
  allocator<char> local_419;
  string local_418;
  NestingState local_3f8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  allocator<char> local_351;
  string local_350;
  cmListFileContext local_330;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  allocator<char> local_291;
  string local_290;
  NestingState local_270;
  undefined4 local_1f4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  cmListFileContext local_1a0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  allocator<char> local_101;
  string local_100;
  value_type local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string *name;
  cmListFileFunction *func;
  iterator __end1;
  iterator __begin1;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range1;
  vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  stack;
  cmListFileParser *this_local;
  
  stack.
  super__Vector_base<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
  ::vector((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
            *)&__range1);
  this_00 = this->ListFile;
  __end1 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                     (&this_00->Functions);
  func = (cmListFileFunction *)
         std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                   (&this_00->Functions);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                *)&func);
    if (!bVar3) {
      bVar3 = std::
              vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
              ::empty((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                       *)&__range1);
      if (bVar3) {
        std::optional<cmListFileContext>::optional(__return_storage_ptr__);
      }
      else {
        pvVar4 = std::
                 vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                 ::back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                         *)&__range1);
        std::optional<cmListFileContext>::optional<cmListFileContext_&,_true>
                  (__return_storage_ptr__,&pvVar4->Context);
      }
LAB_00784d66:
      local_1f4 = 1;
      std::
      vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
      ::~vector((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                 *)&__range1);
      return __return_storage_ptr__;
    }
    name = (string *)
           __gnu_cxx::
           __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
           ::operator*(&__end1);
    local_58 = cmListFileFunction::LowerCaseName_abi_cxx11_((cmListFileFunction *)name);
    bVar3 = std::operator==(local_58,"if");
    psVar2 = name;
    if (bVar3) {
      local_e0.State = If;
      pcVar1 = this->FileName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,pcVar1,&local_101);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_130);
      cmListFileContext::FromListFileFunction
                (&local_e0.Context,(cmListFileFunction *)psVar2,&local_100,&local_130);
      std::
      vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
      ::push_back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                   *)&__range1,&local_e0);
      anon_unknown.dwarf_fd9aeb::NestingState::~NestingState(&local_e0);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_130);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
    }
    else {
      bVar3 = std::operator==(local_58,"elseif");
      if (bVar3) {
        bVar3 = anon_unknown.dwarf_fd9aeb::TopIs
                          ((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                            *)&__range1,If);
        psVar2 = name;
        if (!bVar3) {
          pcVar1 = this->FileName;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,pcVar1,&local_1c1)
          ;
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional(&local_1f0);
          cmListFileContext::FromListFileFunction
                    (&local_1a0,(cmListFileFunction *)psVar2,&local_1c0,&local_1f0);
          std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                    (__return_storage_ptr__,&local_1a0);
          cmListFileContext::~cmListFileContext(&local_1a0);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional(&local_1f0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::allocator<char>::~allocator(&local_1c1);
          goto LAB_00784d66;
        }
        local_270.State = If;
        pcVar1 = this->FileName;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,pcVar1,&local_291);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(&local_2c0);
        cmListFileContext::FromListFileFunction
                  (&local_270.Context,(cmListFileFunction *)psVar2,&local_290,&local_2c0);
        pvVar4 = std::
                 vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                 ::back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                         *)&__range1);
        anon_unknown.dwarf_fd9aeb::NestingState::operator=(pvVar4,&local_270);
        anon_unknown.dwarf_fd9aeb::NestingState::~NestingState(&local_270);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional(&local_2c0);
        std::__cxx11::string::~string((string *)&local_290);
        std::allocator<char>::~allocator(&local_291);
      }
      else {
        bVar3 = std::operator==(local_58,"else");
        if (bVar3) {
          bVar3 = anon_unknown.dwarf_fd9aeb::TopIs
                            ((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                              *)&__range1,If);
          psVar2 = name;
          if (!bVar3) {
            pcVar1 = this->FileName;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_350,pcVar1,&local_351);
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::optional(&local_380);
            cmListFileContext::FromListFileFunction
                      (&local_330,(cmListFileFunction *)psVar2,&local_350,&local_380);
            std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                      (__return_storage_ptr__,&local_330);
            cmListFileContext::~cmListFileContext(&local_330);
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~optional(&local_380);
            std::__cxx11::string::~string((string *)&local_350);
            std::allocator<char>::~allocator(&local_351);
            goto LAB_00784d66;
          }
          local_3f8.State = Else;
          pcVar1 = this->FileName;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,pcVar1,&local_419)
          ;
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional(&local_448);
          cmListFileContext::FromListFileFunction
                    (&local_3f8.Context,(cmListFileFunction *)psVar2,&local_418,&local_448);
          pvVar4 = std::
                   vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                   ::back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                           *)&__range1);
          anon_unknown.dwarf_fd9aeb::NestingState::operator=(pvVar4,&local_3f8);
          anon_unknown.dwarf_fd9aeb::NestingState::~NestingState(&local_3f8);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional(&local_448);
          std::__cxx11::string::~string((string *)&local_418);
          std::allocator<char>::~allocator(&local_419);
        }
        else {
          bVar3 = std::operator==(local_58,"endif");
          if (bVar3) {
            bVar3 = anon_unknown.dwarf_fd9aeb::TopIs
                              ((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                *)&__range1,If);
            if ((!bVar3) &&
               (bVar3 = anon_unknown.dwarf_fd9aeb::TopIs
                                  ((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                    *)&__range1,Else), psVar2 = name, !bVar3)) {
              pcVar1 = this->FileName;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4d8,pcVar1,&local_4d9);
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::optional(&local_508);
              cmListFileContext::FromListFileFunction
                        (&local_4b8,(cmListFileFunction *)psVar2,&local_4d8,&local_508);
              std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                        (__return_storage_ptr__,&local_4b8);
              cmListFileContext::~cmListFileContext(&local_4b8);
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~optional(&local_508);
              std::__cxx11::string::~string((string *)&local_4d8);
              std::allocator<char>::~allocator(&local_4d9);
              goto LAB_00784d66;
            }
            std::
            vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
            ::pop_back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                        *)&__range1);
          }
          else {
            bVar3 = std::operator==(local_58,"while");
            psVar2 = name;
            if (bVar3) {
              local_580.State = While;
              pcVar1 = this->FileName;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_5a0,pcVar1,&local_5a1);
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::optional(&local_5d0);
              cmListFileContext::FromListFileFunction
                        (&local_580.Context,(cmListFileFunction *)psVar2,&local_5a0,&local_5d0);
              std::
              vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
              ::push_back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                           *)&__range1,&local_580);
              anon_unknown.dwarf_fd9aeb::NestingState::~NestingState(&local_580);
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~optional(&local_5d0);
              std::__cxx11::string::~string((string *)&local_5a0);
              std::allocator<char>::~allocator(&local_5a1);
            }
            else {
              bVar3 = std::operator==(local_58,"endwhile");
              if (bVar3) {
                bVar3 = anon_unknown.dwarf_fd9aeb::TopIs
                                  ((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                    *)&__range1,While);
                psVar2 = name;
                if (!bVar3) {
                  pcVar1 = this->FileName;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_660,pcVar1,&local_661);
                  std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::optional(&local_690);
                  cmListFileContext::FromListFileFunction
                            (&local_640,(cmListFileFunction *)psVar2,&local_660,&local_690);
                  std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                            (__return_storage_ptr__,&local_640);
                  cmListFileContext::~cmListFileContext(&local_640);
                  std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~optional(&local_690);
                  std::__cxx11::string::~string((string *)&local_660);
                  std::allocator<char>::~allocator(&local_661);
                  goto LAB_00784d66;
                }
                std::
                vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                ::pop_back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                            *)&__range1);
              }
              else {
                bVar3 = std::operator==(local_58,"foreach");
                psVar2 = name;
                if (bVar3) {
                  local_708.State = Foreach;
                  pcVar1 = this->FileName;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_728,pcVar1,&local_729);
                  std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::optional(&local_758);
                  cmListFileContext::FromListFileFunction
                            (&local_708.Context,(cmListFileFunction *)psVar2,&local_728,&local_758);
                  std::
                  vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                  ::push_back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                               *)&__range1,&local_708);
                  anon_unknown.dwarf_fd9aeb::NestingState::~NestingState(&local_708);
                  std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~optional(&local_758);
                  std::__cxx11::string::~string((string *)&local_728);
                  std::allocator<char>::~allocator(&local_729);
                }
                else {
                  bVar3 = std::operator==(local_58,"endforeach");
                  if (bVar3) {
                    bVar3 = anon_unknown.dwarf_fd9aeb::TopIs
                                      ((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                        *)&__range1,Foreach);
                    psVar2 = name;
                    if (!bVar3) {
                      pcVar1 = this->FileName;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_7e8,pcVar1,&local_7e9);
                      std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::optional(&local_818);
                      cmListFileContext::FromListFileFunction
                                (&local_7c8,(cmListFileFunction *)psVar2,&local_7e8,&local_818);
                      std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                                (__return_storage_ptr__,&local_7c8);
                      cmListFileContext::~cmListFileContext(&local_7c8);
                      std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~optional(&local_818);
                      std::__cxx11::string::~string((string *)&local_7e8);
                      std::allocator<char>::~allocator(&local_7e9);
                      goto LAB_00784d66;
                    }
                    std::
                    vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                    ::pop_back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                *)&__range1);
                  }
                  else {
                    bVar3 = std::operator==(local_58,"function");
                    psVar2 = name;
                    if (bVar3) {
                      local_890.State = Function;
                      pcVar1 = this->FileName;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_8b0,pcVar1,&local_8b1);
                      std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::optional(&local_8e0);
                      cmListFileContext::FromListFileFunction
                                (&local_890.Context,(cmListFileFunction *)psVar2,&local_8b0,
                                 &local_8e0);
                      std::
                      vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                      ::push_back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                   *)&__range1,&local_890);
                      anon_unknown.dwarf_fd9aeb::NestingState::~NestingState(&local_890);
                      std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~optional(&local_8e0);
                      std::__cxx11::string::~string((string *)&local_8b0);
                      std::allocator<char>::~allocator(&local_8b1);
                    }
                    else {
                      bVar3 = std::operator==(local_58,"endfunction");
                      if (bVar3) {
                        bVar3 = anon_unknown.dwarf_fd9aeb::TopIs
                                          ((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                            *)&__range1,Function);
                        psVar2 = name;
                        if (!bVar3) {
                          pcVar1 = this->FileName;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_970,pcVar1,&local_971);
                          std::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::optional(&local_9a0);
                          cmListFileContext::FromListFileFunction
                                    (&local_950,(cmListFileFunction *)psVar2,&local_970,&local_9a0);
                          std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                                    (__return_storage_ptr__,&local_950);
                          cmListFileContext::~cmListFileContext(&local_950);
                          std::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~optional(&local_9a0);
                          std::__cxx11::string::~string((string *)&local_970);
                          std::allocator<char>::~allocator(&local_971);
                          goto LAB_00784d66;
                        }
                        std::
                        vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                        ::pop_back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                    *)&__range1);
                      }
                      else {
                        bVar3 = std::operator==(local_58,"macro");
                        psVar2 = name;
                        if (bVar3) {
                          local_a18.State = Macro;
                          pcVar1 = this->FileName;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_a38,pcVar1,&local_a39);
                          std::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::optional(&local_a68);
                          cmListFileContext::FromListFileFunction
                                    (&local_a18.Context,(cmListFileFunction *)psVar2,&local_a38,
                                     &local_a68);
                          std::
                          vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                          ::push_back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                       *)&__range1,&local_a18);
                          anon_unknown.dwarf_fd9aeb::NestingState::~NestingState(&local_a18);
                          std::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~optional(&local_a68);
                          std::__cxx11::string::~string((string *)&local_a38);
                          std::allocator<char>::~allocator(&local_a39);
                        }
                        else {
                          bVar3 = std::operator==(local_58,"endmacro");
                          if (bVar3) {
                            bVar3 = anon_unknown.dwarf_fd9aeb::TopIs
                                              ((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                                *)&__range1,Macro);
                            psVar2 = name;
                            if (!bVar3) {
                              pcVar1 = this->FileName;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_af8,pcVar1,&local_af9);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional(&local_b28);
                              cmListFileContext::FromListFileFunction
                                        (&local_ad8,(cmListFileFunction *)psVar2,&local_af8,
                                         &local_b28);
                              std::optional<cmListFileContext>::optional<cmListFileContext,_true>
                                        (__return_storage_ptr__,&local_ad8);
                              cmListFileContext::~cmListFileContext(&local_ad8);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_b28);
                              std::__cxx11::string::~string((string *)&local_af8);
                              std::allocator<char>::~allocator(&local_af9);
                              goto LAB_00784d66;
                            }
                            std::
                            vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                            ::pop_back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                        *)&__range1);
                          }
                          else {
                            bVar3 = std::operator==(local_58,"block");
                            psVar2 = name;
                            if (bVar3) {
                              local_ba0.State = Block;
                              pcVar1 = this->FileName;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_bc0,pcVar1,&local_bc1);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::optional(&local_bf0);
                              cmListFileContext::FromListFileFunction
                                        (&local_ba0.Context,(cmListFileFunction *)psVar2,&local_bc0,
                                         &local_bf0);
                              std::
                              vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                              ::push_back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                           *)&__range1,&local_ba0);
                              anon_unknown.dwarf_fd9aeb::NestingState::~NestingState(&local_ba0);
                              std::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~optional(&local_bf0);
                              std::__cxx11::string::~string((string *)&local_bc0);
                              std::allocator<char>::~allocator(&local_bc1);
                            }
                            else {
                              bVar3 = std::operator==(local_58,"endblock");
                              if (bVar3) {
                                bVar3 = anon_unknown.dwarf_fd9aeb::TopIs
                                                  ((
                                                  vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                                  *)&__range1,Block);
                                psVar2 = name;
                                if (!bVar3) {
                                  pcVar1 = this->FileName;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_c80,pcVar1,&local_c81);
                                  std::
                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::optional(&local_cb0);
                                  cmListFileContext::FromListFileFunction
                                            (&local_c60,(cmListFileFunction *)psVar2,&local_c80,
                                             &local_cb0);
                                  std::optional<cmListFileContext>::
                                  optional<cmListFileContext,_true>
                                            (__return_storage_ptr__,&local_c60);
                                  cmListFileContext::~cmListFileContext(&local_c60);
                                  std::
                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~optional(&local_cb0);
                                  std::__cxx11::string::~string((string *)&local_c80);
                                  std::allocator<char>::~allocator(&local_c81);
                                  goto LAB_00784d66;
                                }
                                std::
                                vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                ::pop_back((vector<(anonymous_namespace)::NestingState,_std::allocator<(anonymous_namespace)::NestingState>_>
                                            *)&__range1);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

cm::optional<cmListFileContext> cmListFileParser::CheckNesting() const
{
  std::vector<NestingState> stack;

  for (auto const& func : this->ListFile->Functions) {
    auto const& name = func.LowerCaseName();
    if (name == "if") {
      stack.push_back({
        NestingStateEnum::If,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "elseif") {
      if (!TopIs(stack, NestingStateEnum::If)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.back() = {
        NestingStateEnum::If,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      };
    } else if (name == "else") {
      if (!TopIs(stack, NestingStateEnum::If)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.back() = {
        NestingStateEnum::Else,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      };
    } else if (name == "endif") {
      if (!TopIs(stack, NestingStateEnum::If) &&
          !TopIs(stack, NestingStateEnum::Else)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "while") {
      stack.push_back({
        NestingStateEnum::While,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endwhile") {
      if (!TopIs(stack, NestingStateEnum::While)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "foreach") {
      stack.push_back({
        NestingStateEnum::Foreach,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endforeach") {
      if (!TopIs(stack, NestingStateEnum::Foreach)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "function") {
      stack.push_back({
        NestingStateEnum::Function,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endfunction") {
      if (!TopIs(stack, NestingStateEnum::Function)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "macro") {
      stack.push_back({
        NestingStateEnum::Macro,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endmacro") {
      if (!TopIs(stack, NestingStateEnum::Macro)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    } else if (name == "block") {
      stack.push_back({
        NestingStateEnum::Block,
        cmListFileContext::FromListFileFunction(func, this->FileName),
      });
    } else if (name == "endblock") {
      if (!TopIs(stack, NestingStateEnum::Block)) {
        return cmListFileContext::FromListFileFunction(func, this->FileName);
      }
      stack.pop_back();
    }
  }

  if (!stack.empty()) {
    return stack.back().Context;
  }

  return cm::nullopt;
}